

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O1

void __thiscall UtilTest_byteswap_Test::~UtilTest_byteswap_Test(UtilTest_byteswap_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(UtilTest, byteswap) {
	EXPECT_EQ(byteswap(uint16_t{0x1234}), uint16_t{0x3412})
		<< "hex: " << std::hex << byteswap(uint16_t{0x1234});
	EXPECT_EQ(byteswap(uint32_t{0x12345678UL}), uint32_t{0x78563412UL})
		<< "hex: " << std::hex << byteswap(uint32_t{0x12345678UL});
	EXPECT_EQ(byteswap(uint64_t{0x123456789ABCDEF0ULL}), uint64_t{0xF0DEBC9A78563412ULL})
		<< "hex: " << std::hex << byteswap(uint64_t{0x123456789ABCDEF0ULL});
}